

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jinx.hpp
# Opt level: O0

void __thiscall
Jinx::Impl::PropertyName::PropertyName
          (PropertyName *this,VisibilityType visibility,bool readOnly,String *moduleName,
          String *propertyName,Variant *defaultValue)

{
  char *data;
  size_type len;
  uint64_t uVar1;
  size_t sVar2;
  basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> local_80;
  undefined1 local_60 [8];
  String combinedName;
  Variant *defaultValue_local;
  String *propertyName_local;
  String *moduleName_local;
  bool readOnly_local;
  VisibilityType visibility_local;
  PropertyName *this_local;
  
  this->m_id = 0;
  this->m_visibility = visibility;
  this->m_readOnly = readOnly;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::basic_string
            (&this->m_name,propertyName);
  Jinx::Variant::Variant(&this->m_defaultValue,defaultValue);
  this->m_partCount = 0;
  std::operator+(&local_80,moduleName," ");
  std::operator+((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60,
                 &local_80,propertyName);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            (&local_80);
  data = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::c_str
                   ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
  len = std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::size
                  ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
  uVar1 = GetHash(data,len);
  this->m_id = uVar1;
  sVar2 = GetNamePartCount(propertyName);
  this->m_partCount = sVar2;
  std::__cxx11::basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_>::~basic_string
            ((basic_string<char,_std::char_traits<char>,_Jinx::Allocator<char>_> *)local_60);
  return;
}

Assistant:

inline PropertyName::PropertyName(VisibilityType visibility, bool readOnly, const String & moduleName, const String & propertyName, const Variant & defaultValue) :
		m_visibility(visibility),
		m_readOnly(readOnly),
		m_name(propertyName),
		m_defaultValue(defaultValue)
	{
		String combinedName = moduleName + " " + propertyName;
		m_id = GetHash(combinedName.c_str(), combinedName.size());
		m_partCount = GetNamePartCount(propertyName);
	}